

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_3::DBIter::Prev(DBIter *this)

{
  Comparator *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t extraout_RDX;
  Slice SVar3;
  pointer local_58;
  size_type local_50;
  Slice local_48;
  Slice local_38;
  
  if (this->valid_ == false) {
    __assert_fail("valid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_iter.cc"
                  ,0xd2,"virtual void leveldb::(anonymous namespace)::DBIter::Prev()");
  }
  if (this->direction_ == kForward) {
    iVar2 = (*this->iter_->_vptr_Iterator[2])();
    if ((char)iVar2 == '\0') {
      __assert_fail("iter_->Valid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_iter.cc"
                    ,0xd7,"virtual void leveldb::(anonymous namespace)::DBIter::Prev()");
    }
    local_38.data_._0_4_ = (*this->iter_->_vptr_Iterator[8])();
    local_38.data_._4_4_ = extraout_var;
    local_38.size_ = extraout_RDX;
    SVar3 = ExtractUserKey(&local_38);
    std::__cxx11::string::assign((char *)&this->saved_key_,(ulong)SVar3.data_);
    do {
      (*this->iter_->_vptr_Iterator[7])();
      iVar2 = (*this->iter_->_vptr_Iterator[2])();
      if ((char)iVar2 == '\0') {
        this->valid_ = false;
        (this->saved_key_)._M_string_length = 0;
        *(this->saved_key_)._M_dataplus._M_p = '\0';
        ClearSavedValue(this);
        return;
      }
      pCVar1 = this->user_comparator_;
      iVar2 = (*this->iter_->_vptr_Iterator[8])();
      local_48.data_ = (char *)CONCAT44(extraout_var_00,iVar2);
      local_38 = ExtractUserKey(&local_48);
      local_58 = (this->saved_key_)._M_dataplus._M_p;
      local_50 = (this->saved_key_)._M_string_length;
      iVar2 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_38,&local_58);
    } while (-1 < iVar2);
    this->direction_ = kReverse;
  }
  FindPrevUserEntry(this);
  return;
}

Assistant:

void DBIter::Prev() {
  assert(valid_);

  if (direction_ == kForward) {  // Switch directions?
    // iter_ is pointing at the current entry.  Scan backwards until
    // the key changes so we can use the normal reverse scanning code.
    assert(iter_->Valid());  // Otherwise valid_ would have been false
    SaveKey(ExtractUserKey(iter_->key()), &saved_key_);
    while (true) {
      iter_->Prev();
      if (!iter_->Valid()) {
        valid_ = false;
        saved_key_.clear();
        ClearSavedValue();
        return;
      }
      if (user_comparator_->Compare(ExtractUserKey(iter_->key()), saved_key_) <
          0) {
        break;
      }
    }
    direction_ = kReverse;
  }

  FindPrevUserEntry();
}